

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O2

int __thiscall ncnn::Dequantize::load_model(Dequantize *this,ModelBin *mb)

{
  int iVar1;
  Mat local_70;
  
  (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->scale_data_size,1);
  Mat::operator=(&this->scale_data,&local_70);
  Mat::~Mat(&local_70);
  iVar1 = -100;
  if (((this->scale_data).data != (void *)0x0) &&
     ((long)(this->scale_data).c * (this->scale_data).cstep != 0)) {
    if (this->bias_data_size != 0) {
      (*mb->_vptr_ModelBin[2])(&local_70,mb,(ulong)(uint)this->bias_data_size,1);
      Mat::operator=(&this->bias_data,&local_70);
      Mat::~Mat(&local_70);
      if ((this->bias_data).data == (void *)0x0) {
        return -100;
      }
      if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
        return -100;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int Dequantize::load_model(const ModelBin& mb)
{
    scale_data = mb.load(scale_data_size, 1);
    if (scale_data.empty())
        return -100;

    if (bias_data_size)
    {
        bias_data = mb.load(bias_data_size, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}